

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  istream *piVar6;
  void *pvVar7;
  mapped_type *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type sVar11;
  ulong uVar12;
  char *__data;
  _Alloc_hider _Var13;
  ulong uVar14;
  size_type __pos;
  long lVar15;
  string userdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  string line;
  precise_measurement meas;
  ifstream infile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  size_type *local_2b8;
  precise_unit local_2b0;
  size_type local_2a0;
  undefined8 uStack_298;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  precise_measurement local_250;
  long local_238 [65];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2e0 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    std::operator+(&local_320,"unable to read file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
    pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_320,"\n");
    local_2d8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar10 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p == paVar10) {
      local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_2d8._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
               &local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    _Var13._M_p = local_320._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p == &local_320.field_2) goto LAB_00399a56;
  }
  else {
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_allocated_capacity =
         local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00399378:
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2d8,cVar5);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      if (local_2d8._M_string_length != 0) {
        __pos = 0;
        do {
          bVar1 = local_2d8._M_dataplus._M_p[__pos];
          if ((0x20 < (ulong)bVar1) || ((0x100000600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            if (__pos == 0xffffffffffffffff) break;
            if (bVar1 != 0x22) {
              if (bVar1 == 0x23) break;
              if (bVar1 != 0x27) {
                lVar15 = 1;
                sVar11 = local_2d8._M_string_length;
                _Var13._M_p = local_2d8._M_dataplus._M_p;
                goto LAB_00399480;
              }
            }
            uVar14 = __pos + 1;
            lVar15 = 1;
            goto LAB_00399410;
          }
          __pos = __pos + 1;
        } while (local_2d8._M_string_length != __pos);
      }
      goto LAB_00399378;
    }
    local_320.field_2._M_allocated_capacity = local_2d8.field_2._M_allocated_capacity;
    _Var13._M_p = local_2d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) goto LAB_00399a56;
  }
  operator_delete(_Var13._M_p,local_320.field_2._M_allocated_capacity + 1);
LAB_00399a56:
  std::ifstream::~ifstream(local_238);
  return local_2e0;
LAB_00399410:
  sVar11 = local_2d8._M_string_length;
  _Var13._M_p = local_2d8._M_dataplus._M_p;
  if (((local_2d8._M_string_length <= uVar14) ||
      (pvVar7 = memchr(local_2d8._M_dataplus._M_p + uVar14,(int)local_2d8._M_dataplus._M_p[__pos],
                       local_2d8._M_string_length - uVar14), pvVar7 == (void *)0x0)) ||
     (uVar14 = (long)pvVar7 - (long)_Var13._M_p, uVar14 == 0xffffffffffffffff)) goto LAB_00399480;
  if (_Var13._M_p[uVar14 - 1] == '\\') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_2d8,uVar14 - 1,1);
    goto LAB_00399410;
  }
  lVar15 = (long)pvVar7 + (-__pos - (long)_Var13._M_p);
  sVar11 = local_2d8._M_string_length;
  _Var13._M_p = local_2d8._M_dataplus._M_p;
LAB_00399480:
  uVar14 = lVar15 + __pos;
  if (uVar14 < sVar11) {
LAB_00399488:
    if ((0x3d < (ulong)(byte)_Var13._M_p[uVar14]) ||
       ((0x2800100000000000U >> ((ulong)(byte)_Var13._M_p[uVar14] & 0x3f) & 1) == 0))
    goto LAB_003994a4;
    if (sVar11 - 1 == uVar14) {
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,_Var13._M_p,_Var13._M_p + sVar11);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_320," does not have any valid definitions\n");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                local_320._M_dataplus._M_p,local_320._M_string_length);
      _Var13._M_p = local_2d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        _Var13._M_p = local_2d8._M_dataplus._M_p;
      }
    }
    uVar12 = 1;
    if (1 < (byte)(_Var13._M_p[uVar14 + 1] - 0x3dU)) {
      uVar12 = (ulong)(_Var13._M_p[uVar14 - 1] == '<');
      if (_Var13._M_p[uVar14 - 1] == '<') {
        uVar14 = uVar14 - 1;
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_320,&local_2d8,__pos,uVar14 - __pos);
    while (local_320._M_dataplus._M_p[local_320._M_string_length - 1] == ' ') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_320);
    }
    cVar5 = *local_320._M_dataplus._M_p;
    if (((cVar5 == '\'') || (cVar5 == '\"')) &&
       (local_320._M_dataplus._M_p[local_320._M_string_length - 1] == cVar5)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_320);
      if (local_320._M_string_length != 1) {
        if (local_320._M_string_length - 1 == 1) {
          *local_320._M_dataplus._M_p = local_320._M_dataplus._M_p[1];
        }
        else {
          memmove(local_320._M_dataplus._M_p,local_320._M_dataplus._M_p + 1,
                  local_320._M_string_length - 1);
        }
      }
      local_320._M_dataplus._M_p[local_320._M_string_length - 1] = '\0';
      local_320._M_string_length = local_320._M_string_length - 1;
    }
    if (local_320._M_string_length == 0) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_300," does not specify a user string\n");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                local_300._M_dataplus._M_p,local_300._M_string_length);
    }
    else {
      if (uVar12 + uVar14 + 1 < local_2d8._M_string_length) {
        lVar15 = uVar12 + uVar14;
        do {
          if ((local_2d8._M_dataplus._M_p[lVar15 + 1] != ' ') &&
             (local_2d8._M_dataplus._M_p[lVar15 + 1] != '\t')) {
            if (lVar15 != -2) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_300,&local_2d8,lVar15 + 1U,0xffffffffffffffff);
              cVar5 = local_300._M_dataplus._M_p[local_300._M_string_length - 1];
              while (cVar5 == ' ') {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back(&local_300);
                cVar5 = local_300._M_dataplus._M_p[local_300._M_string_length - 1];
              }
              cVar2 = *local_300._M_dataplus._M_p;
              if (((cVar2 == '\'') || (cVar2 == '\"')) && (cVar5 == cVar2)) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back(&local_300);
                if (local_300._M_string_length != 1) {
                  if (local_300._M_string_length - 1 == 1) {
                    *local_300._M_dataplus._M_p = local_300._M_dataplus._M_p[1];
                  }
                  else {
                    memmove(local_300._M_dataplus._M_p,local_300._M_dataplus._M_p + 1,
                            local_300._M_string_length - 1);
                  }
                }
                local_300._M_dataplus._M_p[local_300._M_string_length - 1] = '\0';
                local_300._M_string_length = local_300._M_string_length - 1;
              }
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_290,local_300._M_dataplus._M_p,
                         local_300._M_dataplus._M_p + local_300._M_string_length);
              measurement_from_string(&local_250,&local_290,defaultMatchFlags);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              uVar3 = local_250.units_._8_8_;
              local_2b8 = (size_type *)local_250.units_.multiplier_;
              if ((((local_250.units_._8_8_ & 0xffffffff) == 0xfa94a488 &&
                    NAN(local_250.units_.multiplier_)) || (NAN(local_250.units_.multiplier_))) ||
                 ((local_250.units_.base_units_ == -0x56b5b78 || (NAN(local_250.value_))))) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_270,&local_2d8,lVar15 + 1U,0xffffffffffffffff);
                pbVar9 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_270," does not generate a valid unit\n");
                local_2b0.multiplier_ = (double)(pbVar9->_M_dataplus)._M_p;
                paVar10 = &pbVar9->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.multiplier_ == paVar10) {
                  local_2a0 = paVar10->_M_allocated_capacity;
                  uStack_298 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
                  local_2b0.multiplier_ = (double)&local_2a0;
                }
                else {
                  local_2a0 = paVar10->_M_allocated_capacity;
                }
                local_2b0._8_8_ = pbVar9->_M_string_length;
                (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar9->_M_string_length = 0;
                (pbVar9->field_2)._M_local_buf[0] = '\0';
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e0,(char *)local_2b0.multiplier_,local_2b0._8_8_);
                if ((size_type *)local_2b0.multiplier_ != &local_2a0) {
                  operator_delete((void *)local_2b0.multiplier_,local_2a0 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != &local_270.field_2) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                local_2b8 = (size_type *)(local_250.units_.multiplier_ * local_250.value_);
                if (local_2d8._M_dataplus._M_p[uVar12 + uVar14] == '>') {
                  if ((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) {
                    pmVar8 = std::__detail::
                             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)user_defined_units_abi_cxx11_,(key_type *)&local_320);
                    uVar4 = local_250.units_._8_8_;
                    pmVar8->multiplier_ = (double)local_2b8;
                    local_250.units_.base_units_ = SUB84(uVar3,0);
                    local_250.units_.commodity_ = SUB84(uVar3,4);
                    pmVar8->base_units_ = local_250.units_.base_units_;
                    pmVar8->commodity_ = local_250.units_.commodity_;
                    _ZN5unitsL21allowUserDefinedUnitsE_0 = _ZN5unitsL21allowUserDefinedUnitsE_0 & 1;
                    local_250.units_._8_8_ = uVar4;
                  }
                }
                else {
                  local_2b0.multiplier_ = (double)local_2b8;
                  if (local_2d8._M_dataplus._M_p[uVar14] == '<') {
                    local_2b0.base_units_ = local_250.units_.base_units_;
                    local_2b0.commodity_ = local_250.units_.commodity_;
                    addUserDefinedOutputUnit((string *)&local_320,&local_2b0);
                  }
                  else {
                    local_2b0.base_units_ = local_250.units_.base_units_;
                    local_2b0.commodity_ = local_250.units_.commodity_;
                    addUserDefinedUnit((string *)&local_320,&local_2b0);
                  }
                }
              }
              goto LAB_003996f9;
            }
            break;
          }
          lVar15 = lVar15 + 1;
        } while (local_2d8._M_string_length - 1 != lVar15);
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_300," does not specify a unit definition string\n");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                local_300._M_dataplus._M_p,local_300._M_string_length);
    }
LAB_003996f9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00399715;
  }
LAB_003994ac:
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_320,_Var13._M_p,_Var13._M_p + sVar11);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_320," is not a valid user defined unit definition\n");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
             local_320._M_dataplus._M_p,local_320._M_string_length);
LAB_00399715:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  goto LAB_00399378;
LAB_003994a4:
  uVar14 = uVar14 + 1;
  if (sVar11 <= uVar14) goto LAB_003994ac;
  goto LAB_00399488;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}